

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global_data.h
# Opt level: O0

void __thiscall
shared_data::update_dump_interval(shared_data *this,bool progress_add,float progress_arg)

{
  byte in_SIL;
  shared_data *in_RDI;
  float in_XMM0_Da;
  double dVar1;
  
  in_RDI->sum_loss_since_last_dump = 0.0;
  in_RDI->old_weighted_labeled_examples = in_RDI->weighted_labeled_examples;
  if ((in_SIL & 1) == 0) {
    dVar1 = weighted_examples(in_RDI);
    in_RDI->dump_interval = (float)dVar1 * in_XMM0_Da;
  }
  else {
    dVar1 = weighted_examples(in_RDI);
    in_RDI->dump_interval = (float)dVar1 + in_XMM0_Da;
  }
  return;
}

Assistant:

inline void update_dump_interval(bool progress_add, float progress_arg)
  {
    sum_loss_since_last_dump = 0.0;
    old_weighted_labeled_examples = weighted_labeled_examples;
    if (progress_add)
      dump_interval = (float)weighted_examples() + progress_arg;
    else
      dump_interval = (float)weighted_examples() * progress_arg;
  }